

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::peer_connection::send_upload_only(peer_connection *this,bool enabled)

{
  bool bVar1;
  uint uVar2;
  bool enabled_local;
  peer_connection *this_local;
  
  if ((((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0) &&
     (uVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(), (uVar2 & 1) == 0)) {
    bVar1 = should_log(this,outgoing_message);
    if (bVar1) {
      peer_log(this,outgoing_message,"UPLOAD_ONLY","%d",(ulong)enabled);
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2d])(this,(ulong)enabled & 1);
  }
  return;
}

Assistant:

void peer_connection::send_upload_only(bool const enabled)
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_connecting || in_handshake()) return;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "UPLOAD_ONLY", "%d"
				, int(enabled));
		}
#endif

		write_upload_only(enabled);
	}